

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.c
# Opt level: O0

void DrawTextRecEx(Font font,char *text,Rectangle rec,float fontSize,float spacing,_Bool wordWrap,
                  Color tint,int selectStart,int selectLength,Color selectTint,Color selectBackTint)

{
  Vector2 position;
  Rectangle rec_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  float fVar4;
  int local_a8;
  int local_a4;
  Color local_98;
  int iStack_74;
  _Bool isGlyphSelected;
  int tmp;
  int glyphWidth;
  int index;
  int codepoint;
  int codepointByteCount;
  int k;
  int i;
  int lastk;
  int endLine;
  int startLine;
  int state;
  float scaleFactor;
  float textOffsetX;
  int textOffsetY;
  int length;
  int selectLength_local;
  int selectStart_local;
  float fStack_2c;
  _Bool wordWrap_local;
  float spacing_local;
  float fontSize_local;
  char *text_local;
  Color selectTint_local;
  Color tint_local;
  Rectangle rec_local;
  
  _selectTint_local = rec._0_8_;
  textOffsetY = selectLength;
  length = selectStart;
  selectLength_local._3_1_ = wordWrap;
  selectStart_local = (int)spacing;
  fStack_2c = fontSize;
  _spacing_local = text;
  text_local._0_4_ = selectTint;
  text_local._4_4_ = tint;
  textOffsetX = (float)TextLength(text);
  scaleFactor = 0.0;
  state = 0;
  startLine = (int)(fStack_2c / (float)font.baseSize);
  endLine = (int)((selectLength_local._3_1_ & 1) == 0);
  lastk = -1;
  i = -1;
  k = -1;
  codepointByteCount = 0;
  codepoint = 0;
  do {
    if ((int)textOffsetX <= codepointByteCount) {
      return;
    }
    index = 0;
    iVar2 = GetNextCodepoint(_spacing_local + codepointByteCount,&index);
    iVar3 = GetGlyphIndex(font,iVar2);
    if (iVar2 == 0x3f) {
      index = 1;
    }
    codepointByteCount = index + -1 + codepointByteCount;
    iStack_74 = 0;
    if (iVar2 != 10) {
      if (font.chars[iVar3].advanceX == 0) {
        fVar4 = font.recs[iVar3].width;
      }
      else {
        fVar4 = (float)font.chars[iVar3].advanceX;
      }
      local_a4 = (int)(fVar4 * (float)startLine + (float)selectStart_local);
      iStack_74 = local_a4;
    }
    rec_local.x = rec.width;
    if (endLine == 0) {
      if (((iVar2 == 0x20) || (iVar2 == 9)) || (iVar2 == 10)) {
        i = codepointByteCount;
      }
      if ((float)state + (float)iStack_74 + 1.0 < rec_local.x) {
        if ((float)(codepointByteCount + 1) == textOffsetX) {
          endLine = 1;
          i = codepointByteCount;
        }
        else if (iVar2 == 10) {
          endLine = 1;
        }
      }
      else {
        local_a8 = codepointByteCount;
        if (0 < i) {
          local_a8 = i;
        }
        i = local_a8;
        if (codepointByteCount == local_a8) {
          i = local_a8 - index;
        }
        if (lastk + index == i) {
          i = codepointByteCount - index;
        }
        endLine = 1;
      }
      if (endLine == 1) {
        state = 0;
        codepointByteCount = lastk;
        iStack_74 = 0;
        iVar2 = codepoint + -1;
        codepoint = k;
        k = iVar2;
      }
    }
    else {
      if (iVar2 == 10) {
        if ((selectLength_local._3_1_ & 1) == 0) {
          scaleFactor = (float)((int)((float)(font.baseSize + font.baseSize / 2) * (float)startLine)
                               + (int)scaleFactor);
          state = 0;
        }
      }
      else {
        if (((selectLength_local._3_1_ & 1) == 0) &&
           (rec_local.x <= (float)state + (float)iStack_74 + 1.0)) {
          scaleFactor = (float)((int)((float)(font.baseSize + font.baseSize / 2) * (float)startLine)
                               + (int)scaleFactor);
          state = 0;
        }
        rec_local.y = rec.height;
        if (rec_local.y < (float)((int)scaleFactor + (int)((float)font.baseSize * (float)startLine))
           ) {
          return;
        }
        bVar1 = false;
        if (((-1 < length) && (length <= codepoint)) && (codepoint < length + textOffsetY)) {
          rec_00.y = (float)tint_local + (float)(int)scaleFactor;
          rec_00.x = (float)selectTint_local + (float)state + -1.0;
          rec_00.width = (float)iStack_74;
          rec_00.height = (float)font.baseSize * (float)startLine;
          DrawRectangleRec(rec_00,selectBackTint);
          bVar1 = true;
        }
        if ((iVar2 != 0x20) && (iVar2 != 9)) {
          if (bVar1) {
            local_98 = text_local._0_4_;
          }
          else {
            local_98 = text_local._4_4_;
          }
          position.y = (float)tint_local + (float)(int)scaleFactor;
          position.x = (float)selectTint_local + (float)state;
          DrawTextCodepoint(font,iVar2,position,fStack_2c,local_98);
        }
      }
      if (((selectLength_local._3_1_ & 1) != 0) && (codepointByteCount == i)) {
        scaleFactor = (float)((int)((float)(font.baseSize + font.baseSize / 2) * (float)startLine) +
                             (int)scaleFactor);
        state = 0;
        lastk = i;
        i = -1;
        iStack_74 = 0;
        length = (k - codepoint) + length;
        codepoint = k;
        endLine = (int)((endLine != 0 ^ 0xffU) & 1);
      }
    }
    state = (int)((float)iStack_74 + (float)state);
    codepointByteCount = codepointByteCount + 1;
    codepoint = codepoint + 1;
  } while( true );
}

Assistant:

void DrawTextRecEx(Font font, const char *text, Rectangle rec, float fontSize, float spacing, bool wordWrap, Color tint, int selectStart, int selectLength, Color selectTint, Color selectBackTint)
{
    int length = TextLength(text);  // Total length in bytes of the text, scanned by codepoints in loop

    int textOffsetY = 0;            // Offset between lines (on line break '\n')
    float textOffsetX = 0.0f;       // Offset X to next character to draw

    float scaleFactor = fontSize/font.baseSize;     // Character quad scaling factor

    // Word/character wrapping mechanism variables
    enum { MEASURE_STATE = 0, DRAW_STATE = 1 };
    int state = wordWrap? MEASURE_STATE : DRAW_STATE;

    int startLine = -1;         // Index where to begin drawing (where a line begins)
    int endLine = -1;           // Index where to stop drawing (where a line ends)
    int lastk = -1;             // Holds last value of the character position

    for (int i = 0, k = 0; i < length; i++, k++)
    {
        // Get next codepoint from byte string and glyph index in font
        int codepointByteCount = 0;
        int codepoint = GetNextCodepoint(&text[i], &codepointByteCount);
        int index = GetGlyphIndex(font, codepoint);

        // NOTE: Normally we exit the decoding sequence as soon as a bad byte is found (and return 0x3f)
        // but we need to draw all of the bad bytes using the '?' symbol moving one byte
        if (codepoint == 0x3f) codepointByteCount = 1;
        i += (codepointByteCount - 1);

        int glyphWidth = 0;
        if (codepoint != '\n')
        {
            glyphWidth = (font.chars[index].advanceX == 0)?
                         (int)(font.recs[index].width*scaleFactor + spacing):
                         (int)(font.chars[index].advanceX*scaleFactor + spacing);
        }

        // NOTE: When wordWrap is ON we first measure how much of the text we can draw before going outside of the rec container
        // We store this info in startLine and endLine, then we change states, draw the text between those two variables
        // and change states again and again recursively until the end of the text (or until we get outside of the container).
        // When wordWrap is OFF we don't need the measure state so we go to the drawing state immediately
        // and begin drawing on the next line before we can get outside the container.
        if (state == MEASURE_STATE)
        {
            // TODO: There are multiple types of spaces in UNICODE, maybe it's a good idea to add support for more
            // Ref: http://jkorpela.fi/chars/spaces.html
            if ((codepoint == ' ') || (codepoint == '\t') || (codepoint == '\n')) endLine = i;

            if ((textOffsetX + glyphWidth + 1) >= rec.width)
            {
                endLine = (endLine < 1)? i : endLine;
                if (i == endLine) endLine -= codepointByteCount;
                if ((startLine + codepointByteCount) == endLine) endLine = (i - codepointByteCount);

                state = !state;
            }
            else if ((i + 1) == length)
            {
                endLine = i;

                state = !state;
            }
            else if (codepoint == '\n') state = !state;

            if (state == DRAW_STATE)
            {
                textOffsetX = 0;
                i = startLine;
                glyphWidth = 0;

                // Save character position when we switch states
                int tmp = lastk;
                lastk = k - 1;
                k = tmp;
            }
        }
        else
        {
            if (codepoint == '\n')
            {
                if (!wordWrap)
                {
                    textOffsetY += (int)((font.baseSize + font.baseSize/2)*scaleFactor);
                    textOffsetX = 0;
                }
            }
            else
            {
                if (!wordWrap && ((textOffsetX + glyphWidth + 1) >= rec.width))
                {
                    textOffsetY += (int)((font.baseSize + font.baseSize/2)*scaleFactor);
                    textOffsetX = 0;
                }

                // When text overflows rectangle height limit, just stop drawing
                if ((textOffsetY + (int)(font.baseSize*scaleFactor)) > rec.height) break;

                // Draw selection background
                bool isGlyphSelected = false;
                if ((selectStart >= 0) && (k >= selectStart) && (k < (selectStart + selectLength)))
                {
                    DrawRectangleRec((Rectangle){ rec.x + textOffsetX - 1, rec.y + textOffsetY, (float)glyphWidth, (float)font.baseSize*scaleFactor }, selectBackTint);
                    isGlyphSelected = true;
                }

                // Draw current character glyph
                if ((codepoint != ' ') && (codepoint != '\t'))
                {
                    DrawTextCodepoint(font, codepoint, (Vector2){ rec.x + textOffsetX, rec.y + textOffsetY }, fontSize, isGlyphSelected? selectTint : tint);
                }
            }

            if (wordWrap && (i == endLine))
            {
                textOffsetY += (int)((font.baseSize + font.baseSize/2)*scaleFactor);
                textOffsetX = 0;
                startLine = endLine;
                endLine = -1;
                glyphWidth = 0;
                selectStart += lastk - k;
                k = lastk;

                state = !state;
            }
        }

        textOffsetX += glyphWidth;
    }
}